

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O1

void __thiscall
Personality::Personality
          (Personality *this,string *n,int t,int spT,int c,int at,int def,int hon,int mf,int mi)

{
  pointer pcVar1;
  string local_50;
  
  pcVar1 = (n->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + n->_M_string_length)
  ;
  BlackCard::BlackCard(&this->super_BlackCard,&local_50,t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_001182e0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->followers;
  (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->followers;
  (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->items;
  (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->items;
  (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->typeP = spT;
  this->cost = c;
  this->tapped = false;
  this->revealed = false;
  this->attack = at;
  this->defense = def;
  this->honour = hon;
  this->dead = false;
  this->maxFollowers = mf;
  this->maxItems = mi;
  return;
}

Assistant:

Personality::Personality(string n, int t, int spT, int c, int at, int def, int hon, int mf, int mi) : BlackCard{n, t}
{
    name = n;
    typeP = Personalities(spT);

    cost = c;

    tapped = false;
    revealed = false;

    attack = at;
    defense = def;
    honour = hon;

    dead = false;

    maxFollowers = mf;
    maxItems = mi;
}